

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * antlr::operator+(string *__return_storage_ptr__,string *lhs,size_t rhs)

{
  char tmp [100];
  
  snprintf(tmp,100,"%lu",rhs);
  std::operator+(__return_storage_ptr__,lhs,tmp);
  return __return_storage_ptr__;
}

Assistant:

string operator+( const ANTLR_USE_NAMESPACE(std)string& lhs, size_t rhs )
{
	char tmp[100];
        snprintf(tmp,100,"%lu",(unsigned long)rhs);
	return lhs+tmp;
}